

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixShmMap(sqlite3_file *fd,int iRegion,int szRegion,int bExtend,void **pp)

{
  unixShmNode *zBuf;
  sqlite3_io_methods *psVar1;
  sqlite3_io_methods *psVar2;
  char **pOld;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  sqlite3_io_methods *p;
  int *piVar9;
  uint *puVar10;
  size_t sVar11;
  unixShmNode *puVar12;
  char **nBytes;
  ulong uVar13;
  sqlite3_mutex *psVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  char *pcVar19;
  u64 uVar20;
  stat sStat;
  undefined1 local_c0 [24];
  uint local_a8;
  undefined4 local_a4;
  uint local_a0;
  long local_90;
  
  uVar4 = (*aSyscall[0x19].pCurrent)();
  uVar8 = 1;
  if (0x7fff < (int)uVar4) {
    uVar8 = (ulong)(uVar4 >> 0xf);
  }
  if (fd[8].pMethods == (sqlite3_io_methods *)0x0) {
    iVar5 = sqlite3_initialize();
    if (iVar5 == 0) {
      p = (sqlite3_io_methods *)sqlite3Malloc(0x18);
    }
    else {
      p = (sqlite3_io_methods *)0x0;
    }
    if (p == (sqlite3_io_methods *)0x0) {
      iVar5 = 7;
    }
    else {
      *(undefined8 *)p = 0;
      p->xClose = (_func_int_sqlite3_file_ptr *)0x0;
      p->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
      if (unixBigLock != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(unixBigLock);
      }
      psVar1 = fd[2].pMethods;
      puVar12 = (unixShmNode *)psVar1->xLock;
      iVar5 = 0;
      if (puVar12 == (unixShmNode *)0x0) {
        psVar2 = fd[7].pMethods;
        iVar5 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&fd[3].pMethods);
        if (iVar5 == 0) {
          sVar11 = strlen((char *)psVar2);
          uVar20 = (long)(int)sVar11 + 0x66;
          iVar5 = sqlite3_initialize();
          if (iVar5 == 0) {
            puVar12 = (unixShmNode *)sqlite3Malloc(uVar20);
          }
          else {
            puVar12 = (unixShmNode *)0x0;
          }
          iVar5 = 7;
          if (puVar12 == (unixShmNode *)0x0) goto LAB_00130a11;
          memset(puVar12,0,uVar20);
          zBuf = puVar12 + 1;
          puVar12->zFilename = (char *)zBuf;
          sqlite3_snprintf((int)sVar11 + 6,(char *)zBuf,"%s-shm",psVar2);
          puVar12->hShm = -1;
          psVar2 = fd[2].pMethods;
          psVar2->xLock = (_func_int_sqlite3_file_ptr_int *)puVar12;
          puVar12->pInode = (unixInodeInfo *)psVar2;
          if (sqlite3Config.bCoreMutex != '\0') {
            iVar7 = sqlite3_initialize();
            if (iVar7 == 0) {
              psVar14 = (*sqlite3Config.mutex.xMutexAlloc)(0);
            }
            else {
              psVar14 = (sqlite3_mutex *)0x0;
            }
            puVar12->pShmMutex = psVar14;
            if (psVar14 != (sqlite3_mutex *)0x0) goto LAB_00130e96;
            goto LAB_00130a14;
          }
LAB_00130e96:
          bVar3 = true;
          if (*(char *)((long)&psVar1->xTruncate + 1) == '\0') {
            iVar5 = sqlite3_uri_boolean((char *)fd[7].pMethods,"readonly_shm",0);
            if (iVar5 == 0) {
              iVar5 = robust_open((char *)zBuf,0x20042,local_a8 & 0x1ff);
              puVar12->hShm = iVar5;
            }
            if (puVar12->hShm < 0) {
              iVar5 = robust_open((char *)zBuf,0x20000,local_a8 & 0x1ff);
              puVar12->hShm = iVar5;
              if (iVar5 < 0) {
                bVar3 = false;
                iVar5 = 0xe;
                sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xa567,
                            "0f80b798b3f4b81a7bb4233c58294edd0f1156f36b6ecf5ab8e83631d468778c");
                unixLogErrorAtLine(0xe,"open",(char *)zBuf,0xa567);
                goto LAB_00130a1b;
              }
              puVar12->isReadonly = '\x01';
            }
            uVar4 = puVar12->hShm;
            iVar5 = (*aSyscall[0x15].pCurrent)();
            if (iVar5 == 0) {
              (*aSyscall[0x14].pCurrent)((ulong)uVar4,local_a4,(ulong)local_a0);
            }
            iVar5 = unixLockSharedMemory((unixFile *)fd,puVar12);
            if ((iVar5 != 0x508) && (iVar5 != 0)) goto LAB_00130a14;
          }
          else {
            iVar5 = 0;
          }
        }
        else {
          iVar5 = 0x70a;
LAB_00130a11:
          puVar12 = (unixShmNode *)0x0;
LAB_00130a14:
          bVar3 = false;
        }
LAB_00130a1b:
        if (bVar3) goto LAB_00130a28;
        unixShmPurge((unixFile *)fd);
        sqlite3_free(p);
        psVar14 = unixBigLock;
      }
      else {
LAB_00130a28:
        *(unixShmNode **)p = puVar12;
        puVar12->nRef = puVar12->nRef + 1;
        fd[8].pMethods = p;
        if (unixBigLock != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(unixBigLock);
        }
        if (puVar12->pShmMutex != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexEnter)(puVar12->pShmMutex);
        }
        p->xClose = (_func_int_sqlite3_file_ptr *)puVar12->pFirst;
        puVar12->pFirst = (unixShm *)p;
        psVar14 = puVar12->pShmMutex;
      }
      if (psVar14 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar14);
      }
    }
    if (iVar5 != 0) {
      return iVar5;
    }
  }
  puVar12 = *(unixShmNode **)fd[8].pMethods;
  if (puVar12->pShmMutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(puVar12->pShmMutex);
  }
  if (puVar12->isUnlocked != '\0') {
    iVar5 = unixLockSharedMemory((unixFile *)fd,puVar12);
    if (iVar5 != 0) goto LAB_00130e25;
    puVar12->isUnlocked = '\0';
  }
  iVar7 = (int)uVar8;
  iVar17 = (iVar7 + iRegion) - (iVar7 + iRegion) % iVar7;
  iVar5 = 0;
  if (iVar17 <= (int)(uint)puVar12->nRegion) goto LAB_00130e25;
  puVar12->szRegion = szRegion;
  iVar5 = 0;
  if (-1 < puVar12->hShm) {
    iVar5 = (*aSyscall[5].pCurrent)((ulong)(uint)puVar12->hShm,local_c0);
    if (iVar5 != 0) {
      iVar5 = 0x130a;
      goto LAB_00130e25;
    }
    iVar6 = iVar17 * szRegion;
    iVar5 = 0;
    if (local_90 < iVar6) {
      if (bExtend == 0) {
        iVar5 = 0;
        goto LAB_00130e25;
      }
      lVar18 = local_90 + 0xfff;
      if (-1 < local_90) {
        lVar18 = local_90;
      }
      iVar16 = iVar6 + 0xfff;
      if (-1 < iVar6) {
        iVar16 = iVar6;
      }
      iVar5 = (int)(lVar18 >> 0xc);
      if (iVar5 < iVar16 >> 0xc) {
        lVar18 = (long)iVar5;
        iVar5 = 0;
        do {
          uVar4 = puVar12->hShm;
          do {
            iVar6 = (*aSyscall[0xc].pCurrent)((ulong)uVar4,"",1);
            if (-1 < iVar6) break;
            piVar9 = __errno_location();
          } while (*piVar9 == 4);
          bVar3 = false;
          if (iVar6 != 1) {
            pcVar19 = puVar12->zFilename;
            puVar10 = (uint *)__errno_location();
            if (pcVar19 == (char *)0x0) {
              pcVar19 = "";
            }
            iVar5 = 0x130a;
            sqlite3_log(0x130a,"os_unix.c:%d: (%d) %s(%s) - %s",0xa5f7,(ulong)*puVar10,"write",
                        pcVar19,"");
            bVar3 = true;
          }
          if (iVar6 != 1) goto LAB_00130c8e;
          lVar18 = lVar18 + 1;
        } while (lVar18 != iVar16 >> 0xc);
        bVar3 = false;
      }
      else {
        bVar3 = false;
        iVar5 = 0;
      }
LAB_00130c8e:
      if (bVar3) goto LAB_00130e25;
    }
  }
  pOld = puVar12->apRegion;
  iVar6 = sqlite3_initialize();
  nBytes = (char **)0x0;
  if (iVar6 == 0) {
    if (0 < iVar17 * 8) {
      nBytes = (char **)(ulong)(uint)(iVar17 * 8);
    }
    nBytes = (char **)sqlite3Realloc(pOld,(u64)nBytes);
  }
  if (nBytes == (char **)0x0) {
    iVar5 = 0xc0a;
  }
  else {
    puVar12->apRegion = nBytes;
    uVar20 = (u64)(iVar7 * szRegion);
    do {
      if (iVar17 <= (int)(uint)puVar12->nRegion) break;
      if (puVar12->hShm < 0) {
        iVar6 = sqlite3_initialize();
        if (iVar6 == 0) {
          pcVar19 = (char *)sqlite3Malloc(uVar20);
        }
        else {
          pcVar19 = (char *)0x0;
        }
        if (pcVar19 != (char *)0x0) {
          memset(pcVar19,0,uVar20);
          goto LAB_00130dbe;
        }
        iVar5 = 7;
        bVar3 = false;
      }
      else {
        pcVar19 = (char *)(*aSyscall[0x16].pCurrent)
                                    (0,uVar20,(ulong)((uint)(puVar12->isReadonly == '\0') * 2 + 1),1
                                     ,(ulong)(uint)puVar12->hShm,
                                     (ulong)puVar12->nRegion * (long)szRegion);
        if (pcVar19 == (char *)0xffffffffffffffff) {
          pcVar19 = puVar12->zFilename;
          puVar10 = (uint *)__errno_location();
          if (pcVar19 == (char *)0x0) {
            pcVar19 = "";
          }
          bVar3 = false;
          iVar5 = 0x150a;
          sqlite3_log(0x150a,"os_unix.c:%d: (%d) %s(%s) - %s",0xa612,(ulong)*puVar10,"mmap",pcVar19,
                      "");
        }
        else {
LAB_00130dbe:
          if (iVar7 != 0) {
            uVar13 = (ulong)puVar12->nRegion;
            uVar15 = uVar8;
            do {
              puVar12->apRegion[uVar13] = pcVar19;
              uVar13 = uVar13 + 1;
              pcVar19 = pcVar19 + szRegion;
              uVar15 = uVar15 - 1;
            } while (uVar15 != 0);
          }
          puVar12->nRegion = puVar12->nRegion + (short)uVar8;
          bVar3 = true;
        }
      }
    } while (bVar3);
  }
LAB_00130e25:
  if (iRegion < (int)(uint)puVar12->nRegion) {
    pcVar19 = puVar12->apRegion[iRegion];
  }
  else {
    pcVar19 = (char *)0x0;
  }
  *pp = pcVar19;
  iVar7 = 8;
  if (iVar5 != 0) {
    iVar7 = iVar5;
  }
  if (puVar12->isReadonly == '\0') {
    iVar7 = iVar5;
  }
  if (puVar12->pShmMutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(puVar12->pShmMutex);
  }
  return iVar7;
}

Assistant:

static int unixShmMap(
  sqlite3_file *fd,               /* Handle open on database file */
  int iRegion,                    /* Region to retrieve */
  int szRegion,                   /* Size of regions */
  int bExtend,                    /* True to extend file if necessary */
  void volatile **pp              /* OUT: Mapped memory */
){
  unixFile *pDbFd = (unixFile*)fd;
  unixShm *p;
  unixShmNode *pShmNode;
  int rc = SQLITE_OK;
  int nShmPerMap = unixShmRegionPerMap();
  int nReqRegion;

  /* If the shared-memory file has not yet been opened, open it now. */
  if( pDbFd->pShm==0 ){
    rc = unixOpenSharedMemory(pDbFd);
    if( rc!=SQLITE_OK ) return rc;
  }

  p = pDbFd->pShm;
  pShmNode = p->pShmNode;
  sqlite3_mutex_enter(pShmNode->pShmMutex);
  if( pShmNode->isUnlocked ){
    rc = unixLockSharedMemory(pDbFd, pShmNode);
    if( rc!=SQLITE_OK ) goto shmpage_out;
    pShmNode->isUnlocked = 0;
  }
  assert( szRegion==pShmNode->szRegion || pShmNode->nRegion==0 );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( pShmNode->hShm>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->hShm<0 || pDbFd->pInode->bProcessLock==0 );

  /* Minimum number of regions required to be mapped. */
  nReqRegion = ((iRegion+nShmPerMap) / nShmPerMap) * nShmPerMap;

  if( pShmNode->nRegion<nReqRegion ){
    char **apNew;                      /* New apRegion[] array */
    int nByte = nReqRegion*szRegion;   /* Minimum required file size */
    struct stat sStat;                 /* Used by fstat() */

    pShmNode->szRegion = szRegion;

    if( pShmNode->hShm>=0 ){
      /* The requested region is not mapped into this processes address space.
      ** Check to see if it has been allocated (i.e. if the wal-index file is
      ** large enough to contain the requested region).
      */
      if( osFstat(pShmNode->hShm, &sStat) ){
        rc = SQLITE_IOERR_SHMSIZE;
        goto shmpage_out;
      }

      if( sStat.st_size<nByte ){
        /* The requested memory region does not exist. If bExtend is set to
        ** false, exit early. *pp will be set to NULL and SQLITE_OK returned.
        */
        if( !bExtend ){
          goto shmpage_out;
        }

        /* Alternatively, if bExtend is true, extend the file. Do this by
        ** writing a single byte to the end of each (OS) page being
        ** allocated or extended. Technically, we need only write to the
        ** last page in order to extend the file. But writing to all new
        ** pages forces the OS to allocate them immediately, which reduces
        ** the chances of SIGBUS while accessing the mapped region later on.
        */
        else{
          static const int pgsz = 4096;
          int iPg;

          /* Write to the last byte of each newly allocated or extended page */
          assert( (nByte % pgsz)==0 );
          for(iPg=(sStat.st_size/pgsz); iPg<(nByte/pgsz); iPg++){
            int x = 0;
            if( seekAndWriteFd(pShmNode->hShm, iPg*pgsz + pgsz-1,"",1,&x)!=1 ){
              const char *zFile = pShmNode->zFilename;
              rc = unixLogError(SQLITE_IOERR_SHMSIZE, "write", zFile);
              goto shmpage_out;
            }
          }
        }
      }
    }

    /* Map the requested memory region into this processes address space. */
    apNew = (char **)sqlite3_realloc(
        pShmNode->apRegion, nReqRegion*sizeof(char *)
    );
    if( !apNew ){
      rc = SQLITE_IOERR_NOMEM_BKPT;
      goto shmpage_out;
    }
    pShmNode->apRegion = apNew;
    while( pShmNode->nRegion<nReqRegion ){
      int nMap = szRegion*nShmPerMap;
      int i;
      void *pMem;
      if( pShmNode->hShm>=0 ){
        pMem = osMmap(0, nMap,
            pShmNode->isReadonly ? PROT_READ : PROT_READ|PROT_WRITE,
            MAP_SHARED, pShmNode->hShm, szRegion*(i64)pShmNode->nRegion
        );
        if( pMem==MAP_FAILED ){
          rc = unixLogError(SQLITE_IOERR_SHMMAP, "mmap", pShmNode->zFilename);
          goto shmpage_out;
        }
      }else{
        pMem = sqlite3_malloc64(nMap);
        if( pMem==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto shmpage_out;
        }
        memset(pMem, 0, nMap);
      }

      for(i=0; i<nShmPerMap; i++){
        pShmNode->apRegion[pShmNode->nRegion+i] = &((char*)pMem)[szRegion*i];
      }
      pShmNode->nRegion += nShmPerMap;
    }
  }

shmpage_out:
  if( pShmNode->nRegion>iRegion ){
    *pp = pShmNode->apRegion[iRegion];
  }else{
    *pp = 0;
  }
  if( pShmNode->isReadonly && rc==SQLITE_OK ) rc = SQLITE_READONLY;
  sqlite3_mutex_leave(pShmNode->pShmMutex);
  return rc;
}